

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<unsigned_int,_0U>::SmallVector
          (SmallVector<unsigned_int,_0U> *this,SmallVector<unsigned_int,_0U> *RHS)

{
  bool bVar1;
  SmallVector<unsigned_int,_0U> *RHS_local;
  SmallVector<unsigned_int,_0U> *this_local;
  
  SmallVectorImpl<unsigned_int>::SmallVectorImpl(&this->super_SmallVectorImpl<unsigned_int>,0);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)RHS);
  if (!bVar1) {
    SmallVectorImpl<unsigned_int>::operator=
              (&this->super_SmallVectorImpl<unsigned_int>,&RHS->super_SmallVectorImpl<unsigned_int>)
    ;
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }